

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<short>::resize(vector<short> *this,size_t new_size_size_t,bool grow_hint)

{
  uint uVar1;
  byte in_DL;
  ulong in_RSI;
  vector<short> *in_RDI;
  uint32_t new_size;
  undefined2 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffda;
  bool grow_hint_00;
  undefined4 in_stack_ffffffffffffffdb;
  undefined3 uVar2;
  byte in_stack_ffffffffffffffdf;
  
  if (0xffffffff < in_RSI) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x217,"void basisu::vector<short>::resize(size_t, bool) [T = short]");
  }
  uVar1 = (uint)in_RSI;
  if (in_RDI->m_size != uVar1) {
    if (uVar1 < in_RDI->m_size) {
      scalar_type<short>::destruct_array
                (in_RDI->m_p + (in_RSI & 0xffffffff),(ulong)(in_RDI->m_size - uVar1));
    }
    else {
      if (in_RDI->m_capacity < uVar1) {
        in_stack_ffffffffffffffd8 = (undefined2)in_RSI;
        in_stack_ffffffffffffffda = (undefined1)(in_RSI >> 0x10);
        uVar2 = (undefined3)((uint)in_stack_ffffffffffffffdb >> 8);
        grow_hint_00 = SUB81(in_RSI >> 0x18,0);
        in_stack_ffffffffffffffdb = CONCAT31(uVar2,grow_hint_00);
        in_stack_ffffffffffffffdf = 1;
        if (uVar1 != in_RDI->m_size + 1) {
          in_stack_ffffffffffffffdf = in_DL & 1;
        }
        increase_capacity(in_RDI,CONCAT13(in_stack_ffffffffffffffdf,uVar2),grow_hint_00,
                          (bool)in_stack_ffffffffffffffda);
      }
      scalar_type<short>::construct_array
                ((short *)in_RDI,
                 CONCAT17(in_stack_ffffffffffffffdf,
                          CONCAT43(in_stack_ffffffffffffffdb,
                                   CONCAT12(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8))));
    }
    in_RDI->m_size = uVar1;
  }
  return;
}

Assistant:

inline void resize(size_t new_size_size_t, bool grow_hint = false)
      {
         if (new_size_size_t > UINT32_MAX)
         {
            assert(0);
            return;
         }

         uint32_t new_size = (uint32_t)new_size_size_t;

         if (m_size != new_size)
         {
            if (new_size < m_size)
               scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
            else
            {
               if (new_size > m_capacity)
                  increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint);

               scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
            }

            m_size = new_size;
         }
      }